

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

int __thiscall QFSFileEngine::mkdir(QFSFileEngine *this,char *__path,__mode_t __mode)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  optional<QFlags<QFileDevice::Permission>_> in_RCX;
  long in_FS_OFFSET;
  QFileSystemEntry local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::QFileSystemEntry(&local_50,(QString *)__path);
  if (__mode == 0) {
    iVar2 = QFileSystemEngine::mkdir
                      ((char *)&local_50,
                       (__mode_t)
                       in_RCX.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                       _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_>.
                       _M_payload);
  }
  else {
    bVar1 = QFileSystemEngine::mkpath(&local_50,in_RCX);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  if (&(local_50.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_50.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_50.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_50.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_50.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_50.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::mkdir(const QString &name, bool createParentDirectories,
                          std::optional<QFile::Permissions> permissions) const
{
    return QFileSystemEngine::createDirectory(QFileSystemEntry(name), createParentDirectories,
                                              permissions);
}